

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::InitializerListNegativeTest::logTestCaseName(InitializerListNegativeTest *this)

{
  ostringstream *this_00;
  int iVar1;
  pointer pTVar2;
  ulong uVar3;
  TestError *this_01;
  MessageBuilder message;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = this->m_current_test_case_index;
  pTVar2 = (this->m_test_cases).
           super__Vector_base<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS,_std::allocator<gl4cts::GLSL420Pack::InitializerListNegativeTest::TESTED_ERRORS>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_198._0_8_ =
       ((this->super_NegativeTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  uVar3 = (ulong)pTVar2[iVar1];
  if (uVar3 < 0xf) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,&DAT_01a795b4 + *(int *)(&DAT_01a795b4 + uVar3 * 4),
               *(long *)(&DAT_01a795f0 + uVar3 * 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x3add);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InitializerListNegativeTest::logTestCaseName()
{
	const TESTED_ERRORS& error = m_test_cases[m_current_test_case_index];

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	switch (error)
	{
	case TYPE_UIVEC_BOOL:
		message << "Wrong type in uvec initializer list";
		break;
	case TYPE_IVEC_BOOL:
		message << "Wrong type in ivec initializer list";
		break;
	case TYPE_VEC_BOOL:
		message << "Wrong type in vec initializer list";
		break;
	case TYPE_MAT_BOOL:
		message << "Wrong type in mat initializer list";
		break;
	case COMPONENTS_VEC_LESS:
		message << "Wrong number of componenets in vec initialize list - less";
		break;
	case COMPONENTS_VEC_MORE:
		message << "Wrong number of componenets in vec initialize list - more";
		break;
	case COMPONENTS_MAT_LESS_ROWS:
		message << "Wrong number of componenets in mat initialize list - less rows";
		break;
	case COMPONENTS_MAT_LESS_COLUMNS:
		message << "Wrong number of componenets in mat initialize list - less columns";
		break;
	case COMPONENTS_MAT_MORE_ROWS:
		message << "Wrong number of componenets in mat initialize list - more rows";
		break;
	case COMPONENTS_MAT_MORE_COLUMNS:
		message << "Wrong number of componenets in mat initialize list - more columns";
		break;
	case LIST_IN_CONSTRUCTOR:
		message << "Initializer list in constructor";
		break;
	case STRUCT_LAYOUT_MEMBER_TYPE:
		message << "Wrong type of structure member";
		break;
	case STRUCT_LAYOUT_MEMBER_COUNT_MORE:
		message << "Wrong number of structure members - more";
		break;
	case STRUCT_LAYOUT_MEMBER_COUNT_LESS:
		message << "Wrong number of structure members - less";
		break;
	case STRUCT_LAYOUT_MEMBER_ORDER:
		message << "Wrong order of structure members";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	message << tcu::TestLog::EndMessage;
}